

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

double __thiscall
MidiInApi::getMessage
          (MidiInApi *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *message)

{
  string *psVar1;
  pointer puVar2;
  bool bVar3;
  double timeStamp;
  double local_40;
  string local_38;
  
  puVar2 = (message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if ((this->inputData_).usingCallback == true) {
    psVar1 = &(this->super_MidiApi).errorString_;
    std::__cxx11::string::assign((char *)psVar1);
    std::__cxx11::string::string((string *)&local_38,(string *)psVar1);
    MidiApi::error(&this->super_MidiApi,WARNING,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    bVar3 = MidiQueue::pop(&(this->inputData_).queue,message,&local_40);
    if (bVar3) {
      return local_40;
    }
  }
  return 0.0;
}

Assistant:

double MidiInApi :: getMessage( std::vector<unsigned char> *message )
{
  message->clear();

  if ( inputData_.usingCallback ) {
    errorString_ = "RtMidiIn::getNextMessage: a user callback is currently set for this port.";
    error( RtMidiError::WARNING, errorString_ );
    return 0.0;
  }

  double timeStamp;
  if ( !inputData_.queue.pop( message, &timeStamp ) )
    return 0.0;

  return timeStamp;
}